

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangularTrimmedSurface::~IfcRectangularTrimmedSurface
          (IfcRectangularTrimmedSurface *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x97da88;
  *(undefined8 *)&this->field_0xb8 = 0x97db50;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x97dab0;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x97dad8;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30
       = 0x97db00;
  *(undefined8 *)&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40 = 0x97db28;
  pcVar1 = (this->Vsense)._M_dataplus._M_p;
  paVar2 = &(this->Vsense).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->Usense)._M_dataplus._M_p;
  paVar2 = &(this->Usense).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

IfcRectangularTrimmedSurface() : Object("IfcRectangularTrimmedSurface") {}